

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * __thiscall google::protobuf::FastUInt32ToBufferLeft(protobuf *this,uint32 u,char *buffer)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  byte *pbVar4;
  uint uVar5;
  
  uVar5 = (uint)this;
  pbVar4 = (byte *)CONCAT44(in_register_00000034,u);
  if (uVar5 < 1000000000) {
    if (99 < uVar5) {
      if (9999 < uVar5) {
        if (999999 < uVar5) {
          if (99999999 < uVar5) {
            uVar1 = ((ulong)this & 0xffffffff) / 100000000;
            iVar2 = (int)uVar1;
            *pbVar4 = (byte)uVar1 | 0x30;
            pbVar4 = pbVar4 + 1;
            goto LAB_00217309;
          }
          if (9999999 < uVar5) goto LAB_00217311;
          uVar1 = ((ulong)this & 0xffffffff) / 1000000;
          iVar2 = (int)uVar1;
          *pbVar4 = (char)uVar1 + 0x30;
          pbVar4 = pbVar4 + 1;
          goto LAB_0021732e;
        }
        if (99999 < uVar5) goto LAB_00217336;
        uVar1 = ((ulong)this & 0xffffffff) / 10000;
        iVar2 = (int)uVar1;
        *pbVar4 = (byte)uVar1 | 0x30;
        pbVar4 = pbVar4 + 1;
        goto LAB_00217353;
      }
      if (999 < uVar5) goto LAB_0021735b;
      uVar3 = (ushort)this / 100;
      *pbVar4 = (byte)uVar3 | 0x30;
      pbVar4 = pbVar4 + 1;
      goto LAB_00217376;
    }
    if (uVar5 < 10) {
      *pbVar4 = (byte)this | 0x30;
      pbVar4 = pbVar4 + 1;
      goto LAB_0021738f;
    }
  }
  else {
    uVar1 = ((ulong)this & 0xffffffff) / 100000000;
    iVar2 = (int)uVar1;
    *(undefined2 *)pbVar4 = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
    pbVar4 = pbVar4 + 2;
LAB_00217309:
    this = (protobuf *)(ulong)(uVar5 + iVar2 * -100000000);
LAB_00217311:
    uVar5 = (uint)this;
    uVar1 = ((ulong)this & 0xffffffff) / 1000000;
    iVar2 = (int)uVar1;
    *(undefined2 *)pbVar4 = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
    pbVar4 = pbVar4 + 2;
LAB_0021732e:
    this = (protobuf *)(ulong)(uVar5 + iVar2 * -1000000);
LAB_00217336:
    uVar5 = (uint)this;
    uVar1 = ((ulong)this & 0xffffffff) / 10000;
    iVar2 = (int)uVar1;
    *(undefined2 *)pbVar4 = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
    pbVar4 = pbVar4 + 2;
LAB_00217353:
    this = (protobuf *)(ulong)(uVar5 + iVar2 * -10000);
LAB_0021735b:
    uVar5 = (uint)this;
    uVar1 = ((ulong)this & 0xffffffff) / 100;
    uVar3 = (uint)uVar1;
    *(undefined2 *)pbVar4 = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
    pbVar4 = pbVar4 + 2;
LAB_00217376:
    this = (protobuf *)(ulong)(uVar5 + uVar3 * -100);
  }
  *(undefined2 *)pbVar4 = *(undefined2 *)(two_ASCII_digits + ((ulong)this & 0xffffffff) * 2);
  pbVar4 = pbVar4 + 2;
LAB_0021738f:
  *pbVar4 = 0;
  return (char *)pbVar4;
}

Assistant:

char* FastUInt32ToBufferLeft(uint32 u, char* buffer) {
  uint32 digits;
  const char *ASCII_digits = nullptr;
  // The idea of this implementation is to trim the number of divides to as few
  // as possible by using multiplication and subtraction rather than mod (%),
  // and by outputting two digits at a time rather than one.
  // The huge-number case is first, in the hopes that the compiler will output
  // that case in one branch-free block of code, and only output conditional
  // branches into it from below.
  if (u >= 1000000000) {  // >= 1,000,000,000
    digits = u / 100000000;  // 100,000,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt100_000_000:
    u -= digits * 100000000;  // 100,000,000
lt100_000_000:
    digits = u / 1000000;  // 1,000,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt1_000_000:
    u -= digits * 1000000;  // 1,000,000
lt1_000_000:
    digits = u / 10000;  // 10,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt10_000:
    u -= digits * 10000;  // 10,000
lt10_000:
    digits = u / 100;
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt100:
    u -= digits * 100;
lt100:
    digits = u;
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
done:
    *buffer = 0;
    return buffer;
  }

  if (u < 100) {
    digits = u;
    if (u >= 10) goto lt100;
    *buffer++ = '0' + digits;
    goto done;
  }
  if (u  <  10000) {   // 10,000
    if (u >= 1000) goto lt10_000;
    digits = u / 100;
    *buffer++ = '0' + digits;
    goto sublt100;
  }
  if (u  <  1000000) {   // 1,000,000
    if (u >= 100000) goto lt1_000_000;
    digits = u / 10000;  //    10,000
    *buffer++ = '0' + digits;
    goto sublt10_000;
  }
  if (u  <  100000000) {   // 100,000,000
    if (u >= 10000000) goto lt100_000_000;
    digits = u / 1000000;  //   1,000,000
    *buffer++ = '0' + digits;
    goto sublt1_000_000;
  }
  // we already know that u < 1,000,000,000
  digits = u / 100000000;   // 100,000,000
  *buffer++ = '0' + digits;
  goto sublt100_000_000;
}